

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

TrackDescriptor * __thiscall
perfetto::CounterTrack::Serialize(TrackDescriptor *__return_storage_ptr__,CounterTrack *this)

{
  char *pcVar1;
  CounterDescriptor *pCVar2;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  CounterDescriptor *local_60;
  CounterDescriptor *counter;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  CounterTrack *local_18;
  CounterTrack *this_local;
  TrackDescriptor *desc;
  
  local_19 = 0;
  local_18 = this;
  this_local = (CounterTrack *)__return_storage_ptr__;
  Track::Serialize(__return_storage_ptr__,&this->super_Track);
  pcVar1 = this->name_;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,pcVar1,&local_41);
  protos::gen::TrackDescriptor::set_name(__return_storage_ptr__,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator(&local_41);
  pCVar2 = protos::gen::TrackDescriptor::mutable_counter(__return_storage_ptr__);
  local_60 = pCVar2;
  if (this->category_ != (char *)0x0) {
    pcVar1 = this->category_;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    protos::gen::CounterDescriptor::add_categories(pCVar2,&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::allocator<char>::~allocator(&local_81);
  }
  if (this->unit_ != CounterDescriptor_Unit_UNIT_UNSPECIFIED) {
    protos::gen::CounterDescriptor::set_unit(local_60,this->unit_);
  }
  pCVar2 = local_60;
  if (this->type_ == CounterDescriptor_BuiltinCounterType_COUNTER_UNSPECIFIED) {
    if (this->unit_name_ != (char *)0x0) {
      pcVar1 = this->unit_name_;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,pcVar1,&local_a9);
      protos::gen::CounterDescriptor::set_unit_name(pCVar2,&local_a8);
      ::std::__cxx11::string::~string((string *)&local_a8);
      ::std::allocator<char>::~allocator(&local_a9);
    }
  }
  else {
    protos::gen::CounterDescriptor::set_type(local_60,this->type_);
  }
  if (this->unit_multiplier_ != 1) {
    protos::gen::CounterDescriptor::set_unit_multiplier(local_60,this->unit_multiplier_);
  }
  if ((this->is_incremental_ & 1U) != 0) {
    protos::gen::CounterDescriptor::set_is_incremental(local_60,(bool)(this->is_incremental_ & 1));
  }
  return __return_storage_ptr__;
}

Assistant:

protos::gen::TrackDescriptor CounterTrack::Serialize() const {
  auto desc = Track::Serialize();
  desc.set_name(name_);
  auto* counter = desc.mutable_counter();
  if (category_)
    counter->add_categories(category_);
  if (unit_ != perfetto::protos::pbzero::CounterDescriptor::UNIT_UNSPECIFIED)
    counter->set_unit(static_cast<protos::gen::CounterDescriptor_Unit>(unit_));
  {
    // if |type| is set, we don't want to emit |unit_name|. Trace processor
    // infers the track name from the type in that case.
    if (type_ !=
        perfetto::protos::gen::CounterDescriptor::COUNTER_UNSPECIFIED) {
      counter->set_type(type_);
    } else if (unit_name_) {
      counter->set_unit_name(unit_name_);
    }
  }
  if (unit_multiplier_ != 1)
    counter->set_unit_multiplier(unit_multiplier_);
  if (is_incremental_)
    counter->set_is_incremental(is_incremental_);
  return desc;
}